

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_> * __thiscall
Lib::OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_>::operator=
          (OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *this,
          OptionBase<Lib::VirtualIterator<Indexing::LiteralClause_*>_> *other)

{
  long *plVar1;
  int iVar2;
  Value VVar3;
  
  if ((this->_isSome == true) && (VVar3 = (this->_elem)._elem, VVar3 != (Value)0x0)) {
    plVar1 = (long *)((long)VVar3 + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)VVar3 + 8))();
    }
  }
  if (other->_isSome == true) {
    VVar3 = (other->_elem)._elem;
    if (VVar3 == (Value)0x0) {
      (this->_elem)._elem = (Value)0x0;
    }
    else {
      iVar2 = *(int *)((long)VVar3 + 8);
      *(int *)((long)VVar3 + 8) = iVar2 + 1;
      (this->_elem)._elem = VVar3;
      *(int *)((long)VVar3 + 8) = iVar2 + 2;
      plVar1 = (long *)((long)VVar3 + 8);
      *(int *)plVar1 = *(int *)plVar1 + -1;
      if (*(int *)plVar1 == 0) {
        (**(code **)(*(long *)VVar3 + 8))();
      }
    }
  }
  this->_isSome = other->_isSome;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }